

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

void gf2SqrTrinomial1(word *b,word *a,qr_o *f,void *stack)

{
  ppSqr((word *)stack,a,f->n,(void *)(f->n * 0x10 + (long)stack));
  gf2RedTrinomial1((word *)stack,f->n,(gf2_trinom_st *)f->params);
  wwCopy(b,(word *)stack,f->n);
  return;
}

Assistant:

static void gf2SqrTrinomial1(word b[], const word a[], const qr_o* f, 
	void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * f->n;
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ppSqr(prod, a, f->n, stack);
	gf2RedTrinomial1(prod, f->n, (const gf2_trinom_st*)f->params);
	wwCopy(b, prod, f->n);
}